

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strislowercase_s.c
# Opt level: O0

_Bool strislowercase_s(char *dest,rsize_t dmax)

{
  long lVar1;
  void *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  errno_t in_stack_ffffffffffffffdc;
  _Bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler((char *)0x0,in_RSI,in_stack_ffffffffffffffdc);
    local_9 = false;
  }
  else if (in_RSI == (void *)0x0) {
    invoke_safe_str_constraint_handler(in_RDI,(void *)0x0,in_stack_ffffffffffffffdc);
    local_9 = false;
  }
  else if (in_RSI < (void *)0x10000001) {
    if (*in_RDI == '\0') {
      local_9 = false;
    }
    else {
      while( true ) {
        bVar2 = false;
        if (in_RSI != (void *)0x0) {
          bVar2 = *in_RDI != '\0';
        }
        if (!bVar2) {
          local_9 = true;
          goto LAB_0010a8e8;
        }
        if ((*in_RDI < 'a') || ('z' < *in_RDI)) break;
        in_RDI = in_RDI + 1;
        in_RSI = (void *)((long)in_RSI + -1);
      }
      local_9 = false;
    }
  }
  else {
    invoke_safe_str_constraint_handler(in_RDI,in_RSI,in_stack_ffffffffffffffdc);
    local_9 = false;
  }
LAB_0010a8e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool
strislowercase_s (const char *dest, rsize_t dmax)
{
    if (!dest) {
        invoke_safe_str_constraint_handler("strislowercase_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strislowercase_s: "
                   "dmax is 0",
                   NULL, ESZEROL);
        return (false);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strislowercase_s: "
                   "dmax exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    while (dmax && *dest) {

        if ((*dest < 'a') || (*dest > 'z')) {
            return (false);
        }
        dest++;
        dmax--;
    }

    return (true);
}